

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20-poly1305.c
# Opt level: O2

void ccp_length_op(ccp_context *ctx,void *blk,int len,unsigned_long seq)

{
  uint32_t *puVar1;
  long local_18;
  
  local_18 = (long)blk << 0x20;
  chacha20_iv(&ctx->a_cipher,(uchar *)&local_18);
  chacha20_iv(&ctx->b_cipher,(uchar *)&local_18);
  puVar1 = (ctx->b_cipher).state + 0xc;
  *puVar1 = *puVar1 + 1;
  smemclr(&local_18,8);
  return;
}

Assistant:

static void ccp_length_op(struct ccp_context *ctx, void *blk, int len,
                          unsigned long seq)
{
    unsigned char iv[8];
    /*
     * According to RFC 4253 (section 6.4), the packet sequence number wraps
     * at 2^32, so its 32 high-order bits will always be zero.
     */
    PUT_32BIT_LSB_FIRST(iv, 0);
    PUT_32BIT_LSB_FIRST(iv + 4, seq);
    chacha20_iv(&ctx->a_cipher, iv);
    chacha20_iv(&ctx->b_cipher, iv);
    /* Reset content block count to 1, as the first is the key for Poly1305 */
    ++ctx->b_cipher.state[12];
    smemclr(iv, sizeof(iv));
}